

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O1

int coda_inflateSetDictionary(z_streamp strm,Bytef *dictionary,uInt dictLength)

{
  internal_state *piVar1;
  int iVar2;
  int iVar3;
  uLong uVar4;
  
  iVar2 = inflateStateCheck(strm);
  iVar3 = -2;
  if ((iVar2 == 0) &&
     ((piVar1 = strm->state, *(int *)(piVar1 + 0x10) == 0 || (*(int *)(piVar1 + 8) == 0x3f3e)))) {
    if (*(int *)(piVar1 + 8) == 0x3f3e) {
      uVar4 = coda_adler32(0,(Bytef *)0x0,0);
      uVar4 = coda_adler32(uVar4,dictionary,dictLength);
      if (uVar4 != *(uLong *)(piVar1 + 0x20)) {
        return -3;
      }
    }
    iVar2 = updatewindow(strm,dictionary + dictLength,dictLength);
    if (iVar2 == 0) {
      *(undefined4 *)(piVar1 + 0x14) = 1;
      iVar3 = 0;
    }
    else {
      *(undefined4 *)(piVar1 + 8) = 0x3f52;
      iVar3 = -4;
    }
  }
  return iVar3;
}

Assistant:

int ZEXPORT inflateSetDictionary(z_streamp strm, const Bytef *dictionary,
                                 uInt dictLength) {
    struct inflate_state FAR *state;
    unsigned long dictid;
    int ret;

    /* check state */
    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    if (state->wrap != 0 && state->mode != DICT)
        return Z_STREAM_ERROR;

    /* check for correct dictionary identifier */
    if (state->mode == DICT) {
        dictid = adler32(0L, Z_NULL, 0);
        dictid = adler32(dictid, dictionary, dictLength);
        if (dictid != state->check)
            return Z_DATA_ERROR;
    }

    /* copy dictionary to window using updatewindow(), which will amend the
       existing dictionary if appropriate */
    ret = updatewindow(strm, dictionary + dictLength, dictLength);
    if (ret) {
        state->mode = MEM;
        return Z_MEM_ERROR;
    }
    state->havedict = 1;
    Tracev((stderr, "inflate:   dictionary set\n"));
    return Z_OK;
}